

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_shader.cpp
# Opt level: O3

void __thiscall FShaderManager::CompileShaders(FShaderManager *this)

{
  uint uVar1;
  char *ShaderPath;
  bool bVar2;
  int iVar3;
  FShader *pFVar4;
  FDefaultShader *pFVar5;
  long lVar6;
  FShaderManager *this_00;
  NameManager *this_01;
  char **ppcVar7;
  int i;
  ulong uVar8;
  char *pcVar9;
  FString name;
  FString local_48;
  FShader **local_40;
  FShaderManager *local_38;
  
  this->mActiveShader = (FShader *)0x0;
  if ((this->mTextureEffects).Count != 0) {
    (this->mTextureEffects).Count = 0;
  }
  if ((this->mTextureEffectsNAT).Count != 0) {
    (this->mTextureEffectsNAT).Count = 0;
  }
  local_38 = (FShaderManager *)&this->mTextureEffectsNAT;
  local_40 = this->mEffectShaders;
  this->mEffectShaders[2] = (FShader *)0x0;
  this->mEffectShaders[3] = (FShader *)0x0;
  this->mEffectShaders[0] = (FShader *)0x0;
  this->mEffectShaders[1] = (FShader *)0x0;
  pcVar9 = "Default";
  pFVar5 = defaultshaders;
  uVar8 = 0;
  this_00 = this;
  do {
    pFVar5 = pFVar5 + 1;
    ShaderPath = pFVar5[-1].gettexelfunc;
    pFVar4 = Compile(this_00,pcVar9,ShaderPath,true);
    this_00 = this;
    TArray<FShader_*,_FShader_*>::Grow(&this->mTextureEffects,1);
    uVar1 = (this->mTextureEffects).Count;
    (this->mTextureEffects).Array[uVar1] = pFVar4;
    (this->mTextureEffects).Count = uVar1 + 1;
    if (uVar8 < 4) {
      pFVar4 = Compile(this_00,pcVar9,ShaderPath,false);
      this_00 = local_38;
      TArray<FShader_*,_FShader_*>::Grow(&local_38->mTextureEffects,1);
      uVar1 = (this->mTextureEffectsNAT).Count;
      (this->mTextureEffectsNAT).Array[uVar1] = pFVar4;
      (this->mTextureEffectsNAT).Count = uVar1 + 1;
    }
    uVar8 = uVar8 + 1;
    pcVar9 = pFVar5->ShaderName;
  } while (uVar8 != 0xc);
  if (usershaders.Count != 0) {
    uVar8 = 0;
    do {
      ExtractFileBase((char *)&local_48,SUB81(usershaders.Array[uVar8].Chars,0));
      this_01 = &FName::NameData;
      iVar3 = FName::NameManager::FindName
                        (&FName::NameData,local_48.Chars,(ulong)*(uint *)(local_48.Chars + -0xc),
                         false);
      pFVar4 = Compile((FShaderManager *)this_01,FName::NameData.NameArray[iVar3].Text,
                       usershaders.Array[uVar8].Chars,true);
      TArray<FShader_*,_FShader_*>::Grow(&this->mTextureEffects,1);
      uVar1 = (this->mTextureEffects).Count;
      (this->mTextureEffects).Array[uVar1] = pFVar4;
      (this->mTextureEffects).Count = uVar1 + 1;
      FString::~FString(&local_48);
      uVar8 = uVar8 + 1;
    } while (uVar8 < usershaders.Count);
  }
  ppcVar7 = &effectshaders[0].defines;
  lVar6 = 0;
  do {
    pFVar4 = (FShader *)operator_new(0x110);
    pcVar9 = ((FEffectShader *)(ppcVar7 + -4))->ShaderName;
    iVar3 = FName::NameManager::FindName(&FName::NameData,pcVar9,false);
    (pFVar4->mName).Index = iVar3;
    pFVar4->currentglowstate = 0;
    pFVar4->currentsplitstate = 0;
    pFVar4->currentcliplinestate = 0;
    pFVar4->currentfixedcolormap = 0;
    pFVar4->currentTextureMatrixState = true;
    pFVar4->currentModelMatrixState = true;
    pFVar4->hFragProg = 0;
    pFVar4->hShader = 0;
    pFVar4->hVertProg = 0;
    bVar2 = FShader::Load(pFVar4,pcVar9,"shaders/glsl/main.vp",ppcVar7[-2],ppcVar7[-1],*ppcVar7);
    if (bVar2) {
      local_40[lVar6] = pFVar4;
    }
    else {
      FShader::~FShader(pFVar4);
      operator_delete(pFVar4,0x110);
    }
    lVar6 = lVar6 + 1;
    ppcVar7 = ppcVar7 + 5;
  } while (lVar6 != 4);
  return;
}

Assistant:

void FShaderManager::CompileShaders()
{
	mActiveShader = NULL;

	mTextureEffects.Clear();
	mTextureEffectsNAT.Clear();
	for (int i = 0; i < MAX_EFFECTS; i++)
	{
		mEffectShaders[i] = NULL;
	}

	for(int i=0;defaultshaders[i].ShaderName != NULL;i++)
	{
		FShader *shc = Compile(defaultshaders[i].ShaderName, defaultshaders[i].gettexelfunc, true);
		mTextureEffects.Push(shc);
		if (i <= 3)
		{
			FShader *shc = Compile(defaultshaders[i].ShaderName, defaultshaders[i].gettexelfunc, false);
			mTextureEffectsNAT.Push(shc);
		}
	}

	for(unsigned i = 0; i < usershaders.Size(); i++)
	{
		FString name = ExtractFileBase(usershaders[i]);
		FName sfn = name;

		FShader *shc = Compile(sfn, usershaders[i], true);
		mTextureEffects.Push(shc);
	}

	for(int i=0;i<MAX_EFFECTS;i++)
	{
		FShader *eff = new FShader(effectshaders[i].ShaderName);
		if (!eff->Load(effectshaders[i].ShaderName, effectshaders[i].vp, effectshaders[i].fp1,
						effectshaders[i].fp2, effectshaders[i].defines))
		{
			delete eff;
		}
		else mEffectShaders[i] = eff;
	}
}